

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::FindOrAddEntry(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                 *this,void *key)

{
  void *key_00;
  PinRecord data;
  undefined1 local_38 [12];
  EntryType *local_28;
  EntryType *entry;
  void *pvStack_18;
  uint targetBucket;
  void *key_local;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  pvStack_18 = key;
  key_local = this;
  entry._4_4_ = HashKeyToBucket(this,key);
  local_28 = FindEntry(this,pvStack_18,entry._4_4_);
  key_00 = pvStack_18;
  if (local_28 == (EntryType *)0x0) {
    Memory::Recycler::PinRecord::PinRecord((PinRecord *)local_38);
    data._12_4_ = 0;
    data.stackBackTraces = (StackBackTraceNode *)local_38._0_8_;
    data.refCount = local_38._8_4_;
    local_28 = AddInternal(this,key_00,data,entry._4_4_);
  }
  return local_28;
}

Assistant:

EntryType * FindOrAddEntry(TKey key)
    {
         uint targetBucket = HashKeyToBucket(key);
         EntryType * entry = FindEntry(key, targetBucket);
         if (entry == nullptr)
         {
            entry = AddInternal(key, TData(), targetBucket);
         }
         return entry;
    }